

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

CppTypeName * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::cppFullName
          (CppTypeName *__return_storage_ptr__,CapnpcCppMain *this,Schema schema,Schema brand,
          Maybe<capnp::InterfaceSchema::Method> *method)

{
  bool bVar1;
  Reader proto;
  Reader brand_00;
  undefined1 auVar2 [40];
  Reader proto_00;
  Reader proto_01;
  ArrayPtr<const_char> AVar3;
  NullableValue<capnp::InterfaceSchema::Method> *pNVar4;
  anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Value::Reader>_2 *paVar5;
  uint uVar6;
  ElementCount EVar7;
  CppTypeName *pCVar8;
  char *pcVar9;
  size_t sVar10;
  Branch *pBVar11;
  size_t sVar12;
  undefined4 uVar13;
  int iVar14;
  undefined8 uVar15;
  Maybe<capnp::schema::Value::Reader> *pMVar16;
  RawSchema *pRVar17;
  RawSchema *pRVar18;
  CapnpcCppMain *pCVar19;
  CapnpcCppMain *extraout_RDX;
  undefined8 uVar20;
  uint64_t annotationId;
  CapnpcCppMain *extraout_RDX_00;
  ElementCount EVar21;
  ulong capacity;
  Dependency *id;
  undefined8 uVar22;
  Maybe<capnp::InterfaceSchema::Method> *pMVar23;
  uint index;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar24;
  Reader RVar25;
  ArrayPtr<const_char> innerName;
  StringPtr SVar26;
  Type type;
  StringPtr name;
  String ownUnqualifiedName;
  Reader parentProto;
  Reader node;
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> builder;
  Reader params;
  Schema parent;
  Fault f;
  Array<capnp::(anonymous_namespace)::CppTypeName> result;
  BrandArgumentList args;
  ulong local_240;
  CapnpcCppMain *local_228;
  CapnpcCppMain *pCStack_220;
  WirePointer *local_218;
  Maybe<capnp::InterfaceSchema::Method> local_200;
  Reader local_1b8;
  undefined1 local_188 [32];
  undefined1 local_168 [16];
  Maybe<kj::_::Mutex::Waiter_&> local_158;
  uint uStack_150;
  BitsPerElementN<23> BStack_14c;
  uint local_148;
  StructPointerCount SStack_144;
  ElementSize EStack_142;
  undefined1 uStack_141;
  int iStack_140;
  undefined4 uStack_13c;
  Schema local_138;
  Schema local_130;
  CppTypeName local_128;
  Array<capnp::(anonymous_namespace)::CppTypeName> local_e8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Schema local_98;
  BrandArgumentList local_90;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  pMVar23 = method;
  local_130.raw = brand.raw;
  local_98.raw = schema.raw;
  Schema::getProto(&local_1b8,&local_98);
  if ((local_1b8._reader.dataSize < 0xc0) ||
     (brand.raw = (RawBrandedSchema *)local_1b8._reader.data,
     *(Dependency **)((long)local_1b8._reader.data + 0x10) == (Dependency *)0x0)) {
    if ((0x6f < local_1b8._reader.dataSize) &&
       (brand.raw = (RawBrandedSchema *)local_1b8._reader.data,
       *(short *)((long)((long)local_1b8._reader.data + 8) + 4) != 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
                ((Fault *)&local_200,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                 ,0x174,FAILED,"node.isFile()",
                 "\"Non-file had scopeId zero; perhaps it\'s a method param / result struct?\"",
                 (char (*) [72])
                 "Non-file had scopeId zero; perhaps it\'s a method param / result struct?");
      kj::_::Debug::Fault::fatal((Fault *)&local_200);
    }
    local_200.ptr._0_8_ = &this->usedImports;
    if (local_1b8._reader.dataSize < 0x40) {
      local_128.name.size_ = 0;
    }
    else {
      local_128.name.size_ = (size_t)*(RawSchema **)local_1b8._reader.data;
    }
    pVar24 = std::
             _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
             ::
             _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                       ();
    proto._reader.pointerCount = local_1b8._reader.pointerCount;
    proto._reader.dataSize = local_1b8._reader.dataSize;
    proto._reader._38_2_ = local_1b8._reader._38_2_;
    proto._reader._44_4_ = local_1b8._reader._44_4_;
    proto._reader.nestingLimit = local_1b8._reader.nestingLimit;
    uVar22 = (CapnpcCppMain *)0xb9c6f99ebf805f2c;
    proto._reader.capTable = local_1b8._reader.capTable;
    proto._reader.segment = local_1b8._reader.segment;
    proto._reader.data = local_1b8._reader.data;
    proto._reader.pointers = local_1b8._reader.pointers;
    uVar15 = annotationValue<capnp::schema::Node::Reader>
                       ((Maybe<capnp::schema::Value::Reader> *)&local_200,
                        (CapnpcCppMain *)0xb9c6f99ebf805f2c,proto,pVar24._8_8_);
    uVar20 = extraout_RDX;
    if (local_200.ptr.isSet == true) {
      brand.raw = (RawBrandedSchema *)
                  ((ulong)local_200.ptr.field_1.value.proto._reader.pointers & 0xffffffff);
      pMVar23 = (Maybe<capnp::InterfaceSchema::Method> *)(ulong)(local_200.ptr.field_1._36_2_ == 0);
      uVar15 = local_200.ptr.field_1._8_8_;
      uVar20 = local_200.ptr.field_1.value.parent.super_Schema.raw;
      uVar22 = local_200.ptr.field_1.value.proto._reader.capTable;
    }
    if (local_200.ptr.isSet == false) {
      local_128.name.size_ = 0x229c0d;
      local_128.name.text.content.ptr = (char *)0x1;
      kj::StringTree::concat<kj::ArrayPtr<char_const>>
                ((StringTree *)&local_200,&local_128.name,(ArrayPtr<const_char> *)uVar20);
      (__return_storage_ptr__->name).size_ = local_200.ptr._0_8_;
      (__return_storage_ptr__->name).text.content.ptr =
           (char *)local_200.ptr.field_1.value.parent.super_Schema.raw;
      (__return_storage_ptr__->name).text.content.size_ = local_200.ptr.field_1._8_8_;
      (__return_storage_ptr__->name).text.content.disposer =
           (ArrayDisposer *)local_200.ptr.field_1.value.proto._reader.segment;
      (__return_storage_ptr__->name).branches.ptr =
           (Branch *)local_200.ptr.field_1.value.proto._reader.capTable;
      (__return_storage_ptr__->name).branches.size_ =
           (size_t)local_200.ptr.field_1.value.proto._reader.data;
      (__return_storage_ptr__->name).branches.disposer =
           (ArrayDisposer *)local_200.ptr.field_1.value.proto._reader.pointers;
      __return_storage_ptr__->isArgDependent = false;
      __return_storage_ptr__->needsTypename = false;
      __return_storage_ptr__->hasInterfaces_ = false;
      __return_storage_ptr__->hasDisambiguatedTemplate_ = false;
    }
    else {
      if (((ulong)pMVar23 & 1) != 0) {
        brand.raw = (RawBrandedSchema *)0x7fffffff;
        uVar15 = (CapnpcCppMain *)0x0;
        uVar22 = (CapnpcCppMain *)0x0;
        uVar20 = (CapnpcCppMain *)0x0;
      }
      local_200.ptr.field_1._16_4_ = (int)brand.raw;
      local_200.ptr._0_8_ = uVar20;
      local_200.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)uVar15;
      local_200.ptr.field_1._8_8_ = uVar22;
      RVar25 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_200,(void *)0x0,0);
      SVar26.content.ptr = RVar25.super_StringPtr.content.size_;
      SVar26.content.size_ = (size_t)brand.raw;
      CppTypeName::makeNamespace(__return_storage_ptr__,RVar25.super_StringPtr.content.ptr,SVar26);
    }
  }
  else {
    if (local_1b8._reader.dataSize < 0xc0) {
      id = (Dependency *)0x0;
    }
    else {
      id = *(Dependency **)((long)local_1b8._reader.data + 0x10);
    }
    local_a8 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    uStack_a0 = 0x7fffffff;
    auVar2 = ZEXT1640(ZEXT816(0));
    brand_00._reader._40_8_ = 0x7fffffff;
    brand_00._reader.segment = (SegmentReader *)auVar2._0_8_;
    brand_00._reader.capTable = (CapTableReader *)auVar2._8_8_;
    brand_00._reader.data = (void *)auVar2._16_8_;
    brand_00._reader.pointers = (WirePointer *)auVar2._24_8_;
    brand_00._reader.dataSize = auVar2._32_4_;
    brand_00._reader.pointerCount = auVar2._36_2_;
    brand_00._reader._38_2_ = auVar2._38_2_;
    uVar15 = this;
    local_138 = SchemaLoader::get(&this->schemaLoader,(uint64_t)id,brand_00,(Schema)0x2872a0);
    local_228 = (CapnpcCppMain *)0x0;
    pCStack_220 = (CapnpcCppMain *)0x0;
    local_218 = (WirePointer *)0x0;
    proto_00._reader.pointerCount = local_1b8._reader.pointerCount;
    proto_00._reader.dataSize = local_1b8._reader.dataSize;
    proto_00._reader._38_2_ = local_1b8._reader._38_2_;
    proto_00._reader._44_4_ = local_1b8._reader._44_4_;
    proto_00._reader.nestingLimit = local_1b8._reader.nestingLimit;
    uVar22 = (CapnpcCppMain *)0xf264a779fef191ce;
    proto_00._reader.capTable = local_1b8._reader.capTable;
    proto_00._reader.segment = local_1b8._reader.segment;
    proto_00._reader.data = local_1b8._reader.data;
    proto_00._reader.pointers = local_1b8._reader.pointers;
    pMVar16 = annotationValue<capnp::schema::Node::Reader>
                        ((Maybe<capnp::schema::Value::Reader> *)&local_200,
                         (CapnpcCppMain *)0xf264a779fef191ce,proto_00,annotationId);
    uVar20 = extraout_RDX_00;
    uVar13 = (int)pMVar16;
    if (local_200.ptr.isSet == true) {
      pMVar23 = (Maybe<capnp::InterfaceSchema::Method> *)(ulong)(local_200.ptr.field_1._36_2_ == 0);
      uVar15 = local_200.ptr.field_1._8_8_;
      uVar20 = local_200.ptr.field_1.value.proto._reader.capTable;
      uVar22 = local_200.ptr.field_1.value.parent.super_Schema.raw;
      uVar13 = local_200.ptr.field_1._40_4_;
    }
    if (local_200.ptr.isSet == false) {
      Schema::getProto((Reader *)&local_200,&local_138);
      if ((ushort)local_200.ptr.field_1._28_2_ < 2) {
        uStack_150 = 0x7fffffff;
        local_168._8_8_ = (CapnpcCppMain *)0x0;
        local_158.ptr = (Waiter *)0x0;
        local_168._0_8_ = (CapnpcCppMain *)0x0;
      }
      else {
        local_158.ptr = (Waiter *)&(local_200.ptr.field_1.value.proto._reader.segment)->id;
        local_168._8_8_ = local_200.ptr.field_1.value.parent.super_Schema.raw;
        local_168._0_8_ = local_200.ptr._0_8_;
        uStack_150 = local_200.ptr.field_1._32_4_;
      }
      _::PointerReader::getList
                ((ListReader *)&local_128,(PointerReader *)local_168,INLINE_COMPOSITE,(word *)0x0);
      EVar7 = (ElementCount)local_128.name.text.content.disposer;
      AVar3.size_ = 1;
      AVar3.ptr = "";
      innerName.size_ = 1;
      innerName.ptr = "";
      if ((ElementCount)local_128.name.text.content.disposer != 0) {
        EVar21 = 0;
        do {
          _::ListReader::getStructElement((StructReader *)local_168,(ListReader *)&local_128,EVar21)
          ;
          if (local_148 < 0x40) {
            pRVar17 = (RawSchema *)0x0;
          }
          else {
            pRVar17 = (RawSchema *)((local_158.ptr)->next).ptr;
          }
          if (local_1b8._reader.dataSize < 0x40) {
            pRVar18 = (RawSchema *)0x0;
          }
          else {
            pRVar18 = *(RawSchema **)local_1b8._reader.data;
          }
          if (pRVar17 == pRVar18) {
            if (SStack_144 == 0) {
              iVar14 = 0x7fffffff;
              local_188._8_8_ = (CapnpcCppMain *)0x0;
              local_188._16_8_ = (WirePointer *)0x0;
              local_188._0_8_ = (CapnpcCppMain *)0x0;
            }
            else {
              local_188._16_8_ = CONCAT44(BStack_14c,uStack_150);
              local_188._8_8_ = local_168._8_8_;
              local_188._0_8_ = local_168._0_8_;
              iVar14 = iStack_140;
            }
            local_188._24_4_ = iVar14;
            innerName = (ArrayPtr<const_char>)
                        _::PointerReader::getBlob<capnp::Text>
                                  ((PointerReader *)local_188,(void *)0x0,0);
            break;
          }
          EVar21 = EVar21 + 1;
          innerName = AVar3;
        } while (EVar7 != EVar21);
      }
      local_240 = innerName.size_;
      if (((local_240 < 2) && (0x6f < (uint)local_200.ptr.field_1._24_4_)) &&
         (*(short *)(local_200.ptr.field_1._8_8_ + 0xc) == 1)) {
        if ((ushort)local_200.ptr.field_1._28_2_ < 4) {
          uStack_150 = 0x7fffffff;
          local_168._8_8_ = (CapnpcCppMain *)0x0;
          local_158.ptr = (Waiter *)0x0;
          local_168._0_8_ = (CapnpcCppMain *)0x0;
        }
        else {
          local_158.ptr =
               (Waiter *)&((local_200.ptr.field_1.value.proto._reader.segment)->ptr).size_;
          local_168._8_8_ = local_200.ptr.field_1.value.parent.super_Schema.raw;
          local_168._0_8_ = local_200.ptr._0_8_;
          uStack_150 = local_200.ptr.field_1._32_4_;
        }
        _::PointerReader::getList
                  ((ListReader *)&local_128,(PointerReader *)local_168,INLINE_COMPOSITE,(word *)0x0)
        ;
        EVar7 = (ElementCount)local_128.name.text.content.disposer;
        if ((ElementCount)local_128.name.text.content.disposer != 0) {
          EVar21 = 0;
          do {
            pCVar19 = (CapnpcCppMain *)local_168;
            _::ListReader::getStructElement
                      ((StructReader *)local_168,(ListReader *)&local_128,EVar21);
            if ((0x4f < local_148) &&
               (*(short *)&((ArrayPtr<const_capnp::word> *)&(local_158.ptr)->prev)->ptr == 1)) {
              if (local_148 < 0xc0) {
                pRVar17 = (RawSchema *)0x0;
              }
              else {
                pRVar17 = (RawSchema *)(local_158.ptr)->predicate;
              }
              if (local_1b8._reader.dataSize < 0x40) {
                pRVar18 = (RawSchema *)0x0;
              }
              else {
                pRVar18 = *(RawSchema **)local_1b8._reader.data;
              }
              if (pRVar17 == pRVar18) {
                proto_01._reader.pointers._4_4_ = BStack_14c;
                proto_01._reader.pointers._0_4_ = uStack_150;
                proto_01._reader.pointerCount = SStack_144;
                proto_01._reader.dataSize = local_148;
                proto_01._reader._38_1_ = EStack_142;
                proto_01._reader._39_1_ = uStack_141;
                proto_01._reader._44_4_ = uStack_13c;
                proto_01._reader.nestingLimit = iStack_140;
                proto_01._reader.capTable = (CapTableReader *)local_168._8_8_;
                proto_01._reader.segment = (SegmentReader *)local_168._0_8_;
                proto_01._reader.data = local_158.ptr;
                SVar26 = protoName<capnp::schema::Field::Reader>(pCVar19,proto_01);
                name.content.ptr = (char *)SVar26.content.size_;
                name.content.size_ = (size_t)pRVar18;
                toTitleCase((String *)local_188,(CapnpcCppMain *)SVar26.content.ptr,name);
                uVar15 = local_188._8_8_;
                pCVar19 = (CapnpcCppMain *)local_188._0_8_;
                local_228 = (CapnpcCppMain *)local_188._0_8_;
                pCStack_220 = (CapnpcCppMain *)local_188._8_8_;
                local_218 = (WirePointer *)local_188._16_8_;
                local_188._0_8_ = (CapnpcCppMain *)0x0;
                local_188._8_8_ = (CapnpcCppMain *)0x0;
                kj::String::~String((String *)local_188);
                if ((CapnpcCppMain *)uVar15 == (CapnpcCppMain *)0x0) {
                  pCVar19 = (CapnpcCppMain *)0x22a50f;
                }
                innerName.size_ =
                     (size_t)(&((NullableValue<capnp::schema::Value::Reader> *)uVar15)->isSet +
                             ((CapnpcCppMain *)uVar15 == (CapnpcCppMain *)0x0));
                innerName.ptr = (char *)pCVar19;
                break;
              }
            }
            EVar21 = EVar21 + 1;
          } while (EVar7 != EVar21);
        }
      }
      local_240 = innerName.size_;
      if (local_240 < 2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                  ((Fault *)&local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-c++.c++"
                   ,0x19b,FAILED,"unqualifiedName != nullptr",
                   "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\"",
                   (char (*) [73])
                   "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
        kj::_::Debug::Fault::fatal((Fault *)&local_128);
      }
    }
    else {
      if (((ulong)pMVar23 & 1) != 0) {
        uVar13 = 0x7fffffff;
        uVar15 = (CapnpcCppMain *)0x0;
        uVar20 = (CapnpcCppMain *)0x0;
        uVar22 = (CapnpcCppMain *)0x0;
      }
      local_200.ptr.field_1._16_4_ = uVar13;
      local_200.ptr._0_8_ = uVar22;
      local_200.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)uVar15;
      local_200.ptr.field_1._8_8_ = uVar20;
      innerName = (ArrayPtr<const_char>)
                  _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_200,(void *)0x0,0);
    }
    local_78.ptr.isSet = (method->ptr).isSet;
    if (local_78.ptr.isSet == true) {
      local_78.ptr.field_1.value.parent.super_Schema.raw =
           (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
      local_78.ptr.field_1._8_8_ = *(undefined8 *)((long)&(method->ptr).field_1 + 8);
      local_78.ptr.field_1.value.proto._reader.segment =
           (method->ptr).field_1.value.proto._reader.segment;
      local_78.ptr.field_1.value.proto._reader.capTable =
           (method->ptr).field_1.value.proto._reader.capTable;
      local_78.ptr.field_1.value.proto._reader.data = (method->ptr).field_1.value.proto._reader.data
      ;
      local_78.ptr.field_1.value.proto._reader.pointers =
           (method->ptr).field_1.value.proto._reader.pointers;
      pNVar4 = &method->ptr;
      local_78.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar4->field_1 + 0x30);
      local_78.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar4->field_1 + 0x34);
      local_78.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar4->field_1 + 0x36);
      local_78.ptr.field_1._56_8_ =
           *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
    }
    cppFullName(__return_storage_ptr__,this,local_138,local_130,&local_78);
    if (local_1b8._reader.pointerCount < 6) {
      local_1b8._reader.nestingLimit = 0x7fffffff;
      local_1b8._reader.capTable = (CapTableReader *)0x0;
      local_200.ptr.field_1._8_8_ = (WirePointer *)0x0;
      local_1b8._reader.segment = (SegmentReader *)0x0;
    }
    else {
      local_200.ptr.field_1._8_8_ = local_1b8._reader.pointers + 5;
    }
    local_200.ptr.field_1._16_4_ = local_1b8._reader.nestingLimit;
    local_200.ptr._0_8_ = local_1b8._reader.segment;
    local_200.ptr.field_1.value.parent.super_Schema.raw =
         (InterfaceSchema)local_1b8._reader.capTable;
    _::PointerReader::getList
              ((ListReader *)local_168,(PointerReader *)&local_200,INLINE_COMPOSITE,(word *)0x0);
    if (uStack_150 == 0) {
      CppTypeName::addMemberType(__return_storage_ptr__,(StringPtr)innerName);
    }
    else {
      if (local_1b8._reader.dataSize < 0x40) {
        pRVar17 = (RawSchema *)0x0;
      }
      else {
        pRVar17 = *(RawSchema **)local_1b8._reader.data;
      }
      Schema::getBrandArgumentsAtScope(&local_90,&local_130,(uint64_t)pRVar17);
      uVar6 = uStack_150;
      capacity = (ulong)uStack_150;
      local_188._0_8_ =
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x40,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_188._16_8_ = (long)&((CapnpcCppMain *)local_188._0_8_)->context + capacity * 0x40;
      local_188._24_8_ = &kj::_::HeapArrayDisposer::instance;
      local_188._8_8_ = local_188._0_8_;
      if (capacity != 0) {
        index = 0;
        pcVar9 = local_128.name.text.content.ptr;
        sVar10 = local_128.name.text.content.size_;
        pBVar11 = local_128.name.branches.ptr;
        sVar12 = local_128.name.branches.size_;
        do {
          local_128.name.branches.size_ = sVar12;
          local_128.name.branches.ptr = pBVar11;
          local_128.name.text.content.size_ = sVar10;
          local_128.name.text.content.ptr = pcVar9;
          type = Schema::BrandArgumentList::operator[](&local_90,index);
          bVar1 = (method->ptr).isSet;
          local_200.ptr.isSet = bVar1;
          if (bVar1 == true) {
            local_200.ptr.field_1.value.parent.super_Schema.raw =
                 (InterfaceSchema)(method->ptr).field_1.value.parent.super_Schema.raw;
            local_200.ptr.field_1._8_8_ = *(long *)((long)&(method->ptr).field_1 + 8);
            local_200.ptr.field_1.value.proto._reader.segment =
                 (method->ptr).field_1.value.proto._reader.segment;
            local_200.ptr.field_1.value.proto._reader.capTable =
                 (method->ptr).field_1.value.proto._reader.capTable;
            local_200.ptr.field_1.value.proto._reader.data =
                 (method->ptr).field_1.value.proto._reader.data;
            local_200.ptr.field_1.value.proto._reader.pointers =
                 (method->ptr).field_1.value.proto._reader.pointers;
            pNVar4 = &method->ptr;
            local_200.ptr.field_1._48_4_ = *(StructDataBitCount *)((long)&pNVar4->field_1 + 0x30);
            local_200.ptr.field_1._52_2_ = *(StructPointerCount *)((long)&pNVar4->field_1 + 0x34);
            local_200.ptr.field_1._54_2_ = *(undefined2 *)((long)&pNVar4->field_1 + 0x36);
            local_200.ptr.field_1._56_8_ =
                 *(undefined8 *)&(method->ptr).field_1.value.proto._reader.nestingLimit;
          }
          typeName(&local_128,this,type,&local_200);
          *(size_t *)(NullableValue<capnp::schema::Value::Reader> *)local_188._8_8_ =
               local_128.name.size_;
          (((anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Value::Reader>_2 *)
           (local_188._8_8_ + 8))->value)._reader.segment =
               (SegmentReader *)local_128.name.text.content.ptr;
          (((anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Value::Reader>_2 *)
           (local_188._8_8_ + 8))->value)._reader.capTable =
               (CapTableReader *)local_128.name.text.content.size_;
          (((anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Value::Reader>_2 *)
           (local_188._8_8_ + 8))->value)._reader.data =
               (void *)CONCAT44(local_128.name.text.content.disposer._4_4_,
                                (ElementCount)local_128.name.text.content.disposer);
          local_128.name.text.content.ptr = (char *)0x0;
          pcVar9 = local_128.name.text.content.ptr;
          local_128.name.text.content.size_ = 0;
          sVar10 = local_128.name.text.content.size_;
          (((anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Value::Reader>_2 *)
           (local_188._8_8_ + 8))->value)._reader.pointers =
               (WirePointer *)local_128.name.branches.ptr;
          paVar5 = (anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Value::Reader>_2 *)
                   (local_188._8_8_ + 8);
          ((StructReader *)paVar5)->dataSize = (undefined4)local_128.name.branches.size_;
          ((StructReader *)paVar5)->pointerCount = local_128.name.branches.size_._4_2_;
          *(undefined2 *)&((StructReader *)paVar5)->field_0x26 = local_128.name.branches.size_._6_2_
          ;
          (((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             *)(local_188._8_8_ + 0x30))->_M_h)._M_buckets =
               (__buckets_ptr)local_128.name.branches.disposer;
          local_128.name.branches.ptr = (Branch *)0x0;
          pBVar11 = local_128.name.branches.ptr;
          local_128.name.branches.size_ = 0;
          sVar12 = local_128.name.branches.size_;
          *(undefined4 *)
           &(((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)(local_188._8_8_ + 0x30))->_M_h)._M_bucket_count = local_128._56_4_;
          local_188._8_8_ =
               &(((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)(local_188._8_8_ + 0x30))->_M_h)._M_before_begin;
          local_128.name.branches.size_ = 0;
          local_128.name.branches.ptr = (Branch *)0x0;
          local_128.name.text.content.size_ = 0;
          local_128.name.text.content.ptr = (char *)0x0;
          index = index + 1;
        } while (uVar6 != index);
      }
      local_e8.size_ = (long)(local_188._8_8_ - local_188._0_8_) >> 6;
      local_e8.ptr = (CppTypeName *)local_188._0_8_;
      local_e8.disposer = (ArrayDisposer *)local_188._24_8_;
      CppTypeName::addMemberTemplate(__return_storage_ptr__,(StringPtr)innerName,&local_e8);
      sVar10 = local_e8.size_;
      pCVar8 = local_e8.ptr;
      if ((CapnpcCppMain *)local_e8.ptr != (CapnpcCppMain *)0x0) {
        local_e8.ptr = (CppTypeName *)0x0;
        local_e8.size_ = 0;
        (**(local_e8.disposer)->_vptr_ArrayDisposer)
                  (local_e8.disposer,pCVar8,0x40,sVar10,sVar10,
                   kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
                   destruct);
      }
    }
    if (local_228 != (CapnpcCppMain *)0x0) {
      (*(code *)**(undefined8 **)&local_218->offsetAndKind)
                (local_218,local_228,1,pCStack_220,pCStack_220,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CppTypeName cppFullName(Schema schema, Schema brand, kj::Maybe<InterfaceSchema::Method> method) {
    auto node = schema.getProto();

    if (node.getScopeId() == 0) {
      // This is the file-level scope. Search for the namespace annotation.
      KJ_REQUIRE(node.isFile(),
          "Non-file had scopeId zero; perhaps it's a method param / result struct?");
      usedImports.insert(node.getId());
      KJ_IF_MAYBE(ns, annotationValue(node, NAMESPACE_ANNOTATION_ID)) {
        return CppTypeName::makeNamespace(ns->getText());
      } else {
        return CppTypeName::makeRoot();
      }
    }